

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_log10_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  uint64_t uVar4;
  ulong uVar5;
  uint uVar6;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 fVar7;
  floatx80 fVar8;
  floatx80 b;
  
  fVar7.low = a.low;
  uVar5 = a._8_8_ & 0xffffffff;
  uVar6 = a._8_4_ & 0x7fff;
  if (uVar6 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      fVar7._8_8_ = uVar5;
      propagateFloatx80NaNOneArg(fVar7,status);
    }
    if ((short)uVar5 < 0) goto LAB_006f0825;
    uVar5 = 0x7fff;
  }
  else {
LAB_006f0825:
    if (fVar7.low != 0 || (short)uVar6 != 0) {
      if ((short)uVar5 < 0) {
        float_raise_m68k('\x01',status);
        fVar7 = floatx80_default_nan_m68k(status);
        return fVar7;
      }
      cVar1 = status->float_rounding_mode;
      cVar2 = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      a_00._8_8_ = uVar5;
      a_00.low = fVar7.low;
      fVar7 = floatx80_logn_m68k(a_00,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      auVar3 = fVar7._0_12_;
      a_01._12_4_ = 0;
      a_01.low = auVar3._0_8_;
      a_01.high = auVar3._8_2_;
      a_01._10_2_ = auVar3._10_2_;
      b._8_8_ = 0x3ffd;
      b.low = 0xde5bd8a937287195;
      fVar7 = floatx80_mul_m68k(a_01,b,status);
      uVar4 = fVar7.low;
      float_raise_m68k(' ',status);
      uVar5 = (ulong)fVar7._8_4_;
      goto LAB_006f08ba;
    }
    float_raise_m68k('\x04',status);
    uVar5 = 0xffff;
  }
  uVar4 = 0;
LAB_006f08ba:
  fVar8._8_8_ = uVar5;
  fVar8.low = uVar4;
  return fVar8;
}

Assistant:

floatx80 floatx80_log10(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    floatx80 fp0, fp1;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign == 0) {
            return packFloatx80(0, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
    }

    if (aExp == 0 && aSig == 0) {
        float_raise(float_flag_divbyzero, status);
        return packFloatx80(1, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aSign) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    fp0 = floatx80_logn(a, status);
    fp1 = packFloatx80(0, 0x3FFD, UINT64_C(0xDE5BD8A937287195)); /* INV_L10 */

    status->float_rounding_mode = user_rnd_mode;
    status->floatx80_rounding_precision = user_rnd_prec;

    a = floatx80_mul(fp0, fp1, status); /* LOGN(X)*INV_L10 */

    float_raise(float_flag_inexact, status);

    return a;
}